

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stty.c
# Opt level: O0

sexp_conflict sexp_make_term_attrs_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  long in_RSI;
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res;
  termios *r;
  sexp_conflict *local_38;
  undefined8 local_30;
  sexp_conflict local_28;
  void *local_20;
  long local_10;
  long local_8;
  
  local_28 = (sexp_conflict)0x43e;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_38,0,0x10);
  local_38 = &local_28;
  local_30 = *(undefined8 *)(local_8 + 0x6080);
  *(sexp_conflict ***)(local_8 + 0x6080) = &local_38;
  auVar1._8_8_ = (long)*(ulong *)(local_10 + 0x28) >> 0x3f;
  auVar1._0_8_ = *(ulong *)(local_10 + 0x28) & 0xfffffffffffffffe;
  local_28 = (sexp_conflict)sexp_alloc_tagged_aux(local_8,0x20,SUB168(auVar1 / SEXT816(2),0));
  pvVar2 = calloc(1,0x3c);
  (local_28->value).cpointer.value = pvVar2;
  local_20 = (local_28->value).cpointer.value;
  memset(local_20,0,0x3c);
  local_28->field_0x5 = local_28->field_0x5 & 0xfd | 2;
  *(undefined8 *)(local_8 + 0x6080) = local_30;
  return local_28;
}

Assistant:

sexp sexp_make_term_attrs_stub (sexp ctx, sexp self, sexp_sint_t n) {
  struct termios* r;
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_alloc_tagged(ctx, sexp_sizeof(cpointer), sexp_unbox_fixnum(sexp_opcode_return_type(self)));
  sexp_cpointer_value(res) = calloc(1, sizeof(struct termios));
  r = (struct termios*) sexp_cpointer_value(res);
  memset(r, 0, sizeof(struct termios));
  sexp_freep(res) = 1;
  sexp_gc_release1(ctx);
  return res;
}